

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string __str;
  string value;
  char *local_f8;
  uint local_f0;
  char local_e8 [16];
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = (char *)0x0;
  local_40[0] = 0;
  std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x106004);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  paVar1 = &local_98.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x1060e9);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x1060ed);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x1060f4);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x106103);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:28:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:40:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:52:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:65:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\t');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,500000000);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98.field_2._8_8_ = plVar2[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar4;
    local_98._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_78._M_unused._M_object = (void *)0x1dcd6500;
  pcStack_60 = std::
               _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/benchmark/bench.cpp:78:16)>
             ::_M_manager;
  local_78._8_8_ = &local_50;
  measure(&local_98,(function<unsigned_long_long_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return 0;
}

Assistant:

int main() {
  std::size_t const n = 500 * 1000 * 1000;
  std::string value;

  // callback functions for the benchmark
   
  // using std::stoull
  auto func1 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      std::size_t nc;
      auto result = std::stoull(value, &nc);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  // using std::strtoull 
  auto func2 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      char* endptr;
      auto result = std::strtoull(value.c_str(), &endptr, 10);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  // using jsteemann::atoi
  auto func3 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      bool valid;
      auto result = jsteemann::atoi<unsigned long long>(value.data(), value.data() + value.size(), valid);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  
  // using jsteemann::atoi_positive
  auto func4 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      bool valid;
      auto result = jsteemann::atoi_positive<unsigned long long>(value.data(), value.data() + value.size(), valid);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  
  // using jsteemann::atoi_positive_unchecked
  auto func5 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      auto result = jsteemann::atoi_positive_unchecked<unsigned long long>(value.data(), value.data() + value.size());
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  
  // use a very short value for starting 
  value = "7";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
  
  
  // three bytes now
  value = "874";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
    

  // try a slightly longer value now
  value = "123456";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
  
  
  // it only gets longer
  value = "12345654666646";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
  
  
  // try a rather long value now
  value = "16323949897939569634";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
}